

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBTree.cpp
# Opt level: O1

void chrono::collision::recurse_scan_OBBs
               (ChMatrix33<double> *PrevRot,Vector *PrevPos,CHOBBTree *mmodel,int nb,void *userdata,
               int current_level,int *counter,
               _func_void_ChMatrix33<double>_ptr_Vector_ptr_Vector_ptr_int_void_ptr *callback)

{
  int nb_00;
  Vector Pos;
  ChMatrix33<double> Rot;
  ChMatrix33<double> tempRot;
  
  *counter = *counter + 1;
  Pos.m_data[0] = 0.0;
  Pos.m_data[1] = 0.0;
  Pos.m_data[2] = 0.0;
  Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)((mmodel->b).
                super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
                ._M_impl.super__Vector_impl_data._M_start + nb);
  Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)PrevRot;
  ChMatrix33<double>::operator=
            (&tempRot,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                       *)&Rot);
  ChTransform<double>::TransformLocalToParent
            (&(mmodel->b).
              super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
              ._M_impl.super__Vector_impl_data._M_start[nb].To,PrevPos,PrevRot);
  Pos.m_data[2] =
       Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  Pos.m_data[1] =
       Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  Pos.m_data[0] =
       Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       tempRot.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       tempRot.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       tempRot.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       tempRot.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       tempRot.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       tempRot.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       tempRot.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       tempRot.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       tempRot.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  (*callback)(&Rot,&Pos,
              &(mmodel->b).
               super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
               ._M_impl.super__Vector_impl_data._M_start[nb].d,current_level,userdata);
  nb_00 = (mmodel->b).
          super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>.
          _M_impl.super__Vector_impl_data._M_start[nb].first_child;
  if (-1 < nb_00) {
    recurse_scan_OBBs(&Rot,&Pos,mmodel,nb_00,userdata,current_level + 1,counter,callback);
    recurse_scan_OBBs(&Rot,&Pos,mmodel,nb_00 + 1,userdata,current_level + 1,counter,callback);
  }
  return;
}

Assistant:

void recurse_scan_OBBs(ChMatrix33<>& PrevRot,
                       Vector& PrevPos,
                       CHOBBTree* mmodel,
                       int nb,
                       void* userdata,
                       int current_level,
                       int& counter,
                       void callback(ChMatrix33<>& Rot, Vector& Pos, Vector& d, int level, void* userdata)) {
    counter++;

    // compute root-relative coords for each box
    ChMatrix33<> Rot;
    Vector Pos;
    ChMatrix33<> tempRot;
    Vector tempPos;
    tempRot = PrevRot * mmodel->child(nb)->Rot;
    tempPos = ChTransform<>::TransformLocalToParent(mmodel->child(nb)->To, PrevPos, PrevRot);
    Rot = tempRot;
    Pos = tempPos;

    // execute callback
    callback(Rot, Pos, mmodel->child(nb)->d, current_level, userdata);

    // break recursion on leaf
    if (mmodel->child(nb)->IsLeaf())
        return;

    int c1 = mmodel->child(nb)->first_child;
    int c2 = c1 + 1;

    int new_currlevel = current_level + 1;

    recurse_scan_OBBs(Rot, Pos, mmodel, c1, userdata, new_currlevel, counter, callback);

    recurse_scan_OBBs(Rot, Pos, mmodel, c2, userdata, new_currlevel, counter, callback);
}